

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Parser.h
# Opt level: O0

ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_2UL> * __thiscall
soul::StructuralParser::parseEndpointTypeList
          (ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_2UL>
           *__return_storage_ptr__,StructuralParser *this,EndpointType endpointType)

{
  bool bVar1;
  Expression *pEVar2;
  size_t sVar3;
  CompileMessage local_a0;
  pool_ref<soul::AST::Expression> local_68;
  char *local_60;
  char *local_58;
  pool_ref<soul::AST::Expression> local_50;
  char *local_48;
  undefined1 local_30 [8];
  CodeLocation loc;
  EndpointType endpointType_local;
  StructuralParser *this_local;
  ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_2UL> *result;
  
  loc.location.data._3_1_ = 0;
  loc.location.data._4_4_ = endpointType;
  ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_2UL>::ArrayWithPreallocation
            (__return_storage_ptr__);
  CodeLocation::CodeLocation((CodeLocation *)local_30,&(this->super_SOULTokeniser).location);
  local_48 = "(";
  bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
          ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x4d4496);
  if (bVar1) {
    while( true ) {
      pEVar2 = parseType(this,eventType);
      pool_ref<soul::AST::Expression>::pool_ref<soul::AST::Expression,void>(&local_50,pEVar2);
      ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_2UL>::push_back
                (__return_storage_ptr__,&local_50);
      pool_ref<soul::AST::Expression>::~pool_ref(&local_50);
      local_58 = ")";
      bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
              ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x4d2078);
      if (bVar1) break;
      local_60 = ",";
      Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
      ::expect<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)",");
    }
  }
  else {
    pEVar2 = parseType(this,eventType);
    pool_ref<soul::AST::Expression>::pool_ref<soul::AST::Expression,void>(&local_68,pEVar2);
    ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_2UL>::push_back
              (__return_storage_ptr__,&local_68);
    pool_ref<soul::AST::Expression>::~pool_ref(&local_68);
  }
  bVar1 = isEvent(loc.location.data._4_4_);
  if ((!bVar1) &&
     (sVar3 = ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_2UL>::size
                        (__return_storage_ptr__), 1 < sVar3)) {
    Errors::noMultipleTypesOnEndpoint<>();
    CodeLocation::throwError((CodeLocation *)local_30,&local_a0);
  }
  loc.location.data._3_1_ = 1;
  CodeLocation::~CodeLocation((CodeLocation *)local_30);
  if ((loc.location.data._3_1_ & 1) == 0) {
    ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_2UL>::~ArrayWithPreallocation
              (__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

decltype (AST::EndpointDetails::dataTypes) parseEndpointTypeList (EndpointType endpointType)
    {
        decltype (AST::EndpointDetails::dataTypes) result;
        auto loc = location;

        if (matchIf (Operator::openParen))
        {
            for (;;)
            {
                result.push_back (parseType (ParseTypeContext::eventType));

                if (matchIf (Operator::closeParen))
                    break;

                expect (Operator::comma);
            }
        }
        else
        {
            result.push_back (parseType (ParseTypeContext::eventType));
        }

        if (! isEvent (endpointType) && result.size() > 1)
            loc.throwError (Errors::noMultipleTypesOnEndpoint());

        return result;
    }